

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::do_call
          (Dynamic_Object_Constructor *this,Function_Params *params,
          Type_Conversions_State *t_conversions)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  Boxed_Value *__first;
  Boxed_Value *__last;
  element_type *params_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Boxed_Value BVar2;
  Boxed_Value *local_168;
  Function_Params local_130;
  undefined1 local_120 [32];
  const_iterator local_100;
  allocator<chaiscript::Boxed_Value> local_f1;
  undefined1 local_f0 [16];
  Boxed_Value local_e0;
  undefined1 local_d0 [8];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_params;
  string local_a8;
  Dynamic_Object local_88;
  byte local_29;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Dynamic_Object_Constructor *this_local;
  Boxed_Value *bv;
  
  local_29 = 0;
  t_conversions_local = t_conversions;
  params_local = params;
  this_local = this;
  std::__cxx11::string::string
            ((string *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params[2].m_end);
  Dynamic_Object::Dynamic_Object(&local_88,&local_a8);
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
            ((Boxed_Value *)this,&local_88,true);
  Dynamic_Object::~Dynamic_Object(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  Boxed_Value::Boxed_Value((Boxed_Value *)local_f0,(Boxed_Value *)this);
  local_e0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_e0.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_f0;
  std::allocator<chaiscript::Boxed_Value>::allocator(&local_f1);
  __l._M_len = (size_type)
               local_e0.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_e0.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_d0,
             __l,&local_f1);
  std::allocator<chaiscript::Boxed_Value>::~allocator(&local_f1);
  local_168 = &local_e0;
  do {
    local_168 = local_168 + -1;
    Boxed_Value::~Boxed_Value(local_168);
  } while (local_168 != (Boxed_Value *)local_f0);
  local_120._24_8_ =
       std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                 ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                  local_d0);
  __gnu_cxx::
  __normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
  ::__normal_iterator<chaiscript::Boxed_Value*>
            ((__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
              *)&local_100,
             (__normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
              *)(local_120 + 0x18));
  __first = Function_Params::begin((Function_Params *)t_conversions_local);
  __last = Function_Params::end((Function_Params *)t_conversions_local);
  local_120._16_8_ =
       std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
       insert<chaiscript::Boxed_Value_const*,void>
                 ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)
                  local_d0,local_100,__first,__last);
  params_00 = std::
              __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&params[4].m_end);
  Function_Params::Function_Params
            (&local_130,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_d0);
  Proxy_Function_Base::operator()
            ((Proxy_Function_Base *)local_120,(Function_Params *)params_00,
             (Type_Conversions_State *)&local_130);
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_120);
  local_29 = 1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_d0);
  _Var1._M_pi = extraout_RDX;
  if ((local_29 & 1) == 0) {
    Boxed_Value::~Boxed_Value((Boxed_Value *)this);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) const override {
          auto bv = Boxed_Value(Dynamic_Object(m_type_name), true);
          std::vector<Boxed_Value> new_params{bv};
          new_params.insert(new_params.end(), params.begin(), params.end());

          (*m_func)(chaiscript::Function_Params{new_params}, t_conversions);

          return bv;
        }